

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::RandSeqProductionSymbol_const*,void>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::RandSeqProductionSymbol_const*const,unsigned_int>,128ul,16ul>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::RandSeqProductionSymbol_const*&&,unsigned_int&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::RandSeqProductionSymbol_const*,void>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::RandSeqProductionSymbol_const*const,unsigned_int>,128ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::ast::RandSeqProductionSymbol_*&&,_unsigned_int_&&> *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  ulong uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  RandSeqProductionSymbol **ppRVar6;
  uint *puVar7;
  uint uVar8;
  ushort uVar9;
  ulong uVar10;
  group_type_pointer pgVar11;
  pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int> *ppVar12;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  
  uVar3 = arrays_->groups_size_mask;
  pgVar4 = arrays_->groups_;
  pgVar11 = __return_storage_ptr__->pg;
  ppVar5 = arrays_->elements_;
  ppRVar6 = args->first;
  puVar7 = args->second;
  uVar14 = (ulong)__return_storage_ptr__->n;
  ppVar12 = __return_storage_ptr__->p;
  lVar13 = 1;
  while( true ) {
    pgVar1 = pgVar4 + pos0;
    pgVar2 = pgVar4 + pos0;
    auVar15[0] = -(pgVar2->m[0].n == '\0');
    auVar15[1] = -(pgVar2->m[1].n == '\0');
    auVar15[2] = -(pgVar2->m[2].n == '\0');
    auVar15[3] = -(pgVar2->m[3].n == '\0');
    auVar15[4] = -(pgVar2->m[4].n == '\0');
    auVar15[5] = -(pgVar2->m[5].n == '\0');
    auVar15[6] = -(pgVar2->m[6].n == '\0');
    auVar15[7] = -(pgVar2->m[7].n == '\0');
    auVar15[8] = -(pgVar2->m[8].n == '\0');
    auVar15[9] = -(pgVar2->m[9].n == '\0');
    auVar15[10] = -(pgVar2->m[10].n == '\0');
    auVar15[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar15[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar15[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar15[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar15[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar9 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
    if (uVar9 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar8 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar14 = (ulong)uVar8;
      uVar10 = (ulong)(uVar8 << 4);
      ppVar12 = (pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int> *)
                ((long)&ppVar5[pos0 * 0xf].first + uVar10);
      *(RandSeqProductionSymbol **)((long)&ppVar5[pos0 * 0xf].first + uVar10) = *ppRVar6;
      *(uint *)((long)&ppVar5[pos0 * 0xf].second + uVar10) = *puVar7;
      pgVar1->m[uVar14].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar11 = pgVar1;
    }
    if (uVar9 != 0) break;
    pos0 = pos0 + lVar13 & uVar3;
    lVar13 = lVar13 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar14;
  __return_storage_ptr__->p = ppVar12;
  __return_storage_ptr__->pg = pgVar11;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }